

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

Camera * rw::Camera::streamRead(Stream *stream)

{
  bool bVar1;
  Camera *this;
  CameraChunkData buf;
  V2d local_38;
  V2d local_30;
  float32 local_28;
  float32 local_24;
  float32 local_20;
  int32 local_1c;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    Stream::read32(stream,&local_38,0x20);
    this = create();
    this->viewWindow = local_38;
    this->viewOffset = local_30;
    this->nearPlane = local_28;
    this->farPlane = local_24;
    this->fogPlane = local_20;
    this->projection = local_1c;
    bVar1 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
    if (bVar1) {
      return this;
    }
    destroy(this);
  }
  else {
    streamRead();
  }
  return (Camera *)0x0;
}

Assistant:

Camera*
Camera::streamRead(Stream *stream)
{
	CameraChunkData buf;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(CameraChunkData));
	Camera *cam = Camera::create();
	cam->viewWindow = buf.viewWindow;
	cam->viewOffset = buf.viewOffset;
	cam->nearPlane = buf.nearPlane;
	cam->farPlane = buf.farPlane;
	cam->fogPlane = buf.fogPlane;
	cam->projection = buf.projection;
	if(s_plglist.streamRead(stream, cam))
		return cam;
	cam->destroy();
	return nil;
}